

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv_udp_init_ex(uv_loop_t *loop,uv_udp_t *handle,uint flags)

{
  uint domain_00;
  int local_30;
  int fd;
  int err;
  int domain;
  uint flags_local;
  uv_udp_t *handle_local;
  uv_loop_t *loop_local;
  
  domain_00 = flags & 0xff;
  if (((domain_00 == 2) || (domain_00 == 10)) || (domain_00 == 0)) {
    if ((flags & 0xffffff00) == 0) {
      if (domain_00 == 0) {
        local_30 = -1;
      }
      else {
        local_30 = uv__socket(domain_00,2,0);
        if (local_30 < 0) {
          return local_30;
        }
      }
      handle->loop = loop;
      handle->type = UV_UDP;
      handle->flags = 0x2000;
      handle->handle_queue[0] = loop->handle_queue;
      handle->handle_queue[1] = loop->handle_queue[1];
      *(void ***)handle->handle_queue[1] = handle->handle_queue;
      loop->handle_queue[1] = handle->handle_queue;
      handle->next_closing = (uv_handle_t *)0x0;
      handle->alloc_cb = (uv_alloc_cb)0x0;
      handle->recv_cb = (uv_udp_recv_cb)0x0;
      handle->send_queue_size = 0;
      handle->send_queue_count = 0;
      uv__io_init(&handle->io_watcher,uv__udp_io,local_30);
      handle->write_queue[0] = handle->write_queue;
      handle->write_queue[1] = handle->write_queue;
      handle->write_completed_queue[0] = handle->write_completed_queue;
      handle->write_completed_queue[1] = handle->write_completed_queue;
      loop_local._4_4_ = 0;
    }
    else {
      loop_local._4_4_ = -0x16;
    }
  }
  else {
    loop_local._4_4_ = -0x16;
  }
  return loop_local._4_4_;
}

Assistant:

int uv_udp_init_ex(uv_loop_t* loop, uv_udp_t* handle, unsigned int flags) {
  int domain;
  int err;
  int fd;

  /* Use the lower 8 bits for the domain */
  domain = flags & 0xFF;
  if (domain != AF_INET && domain != AF_INET6 && domain != AF_UNSPEC)
    return -EINVAL;

  if (flags & ~0xFF)
    return -EINVAL;

  if (domain != AF_UNSPEC) {
    err = uv__socket(domain, SOCK_DGRAM, 0);
    if (err < 0)
      return err;
    fd = err;
  } else {
    fd = -1;
  }

  uv__handle_init(loop, (uv_handle_t*)handle, UV_UDP);
  handle->alloc_cb = NULL;
  handle->recv_cb = NULL;
  handle->send_queue_size = 0;
  handle->send_queue_count = 0;
  uv__io_init(&handle->io_watcher, uv__udp_io, fd);
  QUEUE_INIT(&handle->write_queue);
  QUEUE_INIT(&handle->write_completed_queue);
  return 0;
}